

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O2

int __thiscall crnlib::dynamic_stream::open(dynamic_stream *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  dynamic_string *pdVar2;
  attribs_t in_CX;
  char *p;
  
  (*(this->super_data_stream)._vptr_data_stream[3])();
  puVar1 = &(this->super_data_stream).field_0x1a;
  *puVar1 = *puVar1 | 1;
  vector<unsigned_char>::clear(&this->m_buf);
  vector<unsigned_char>::resize(&this->m_buf,(uint)__file,false);
  this->m_ofs = 0;
  p = "dynamic_stream";
  if (___oflag != (char *)0x0) {
    p = ___oflag;
  }
  pdVar2 = dynamic_string::set(&(this->super_data_stream).m_name,p,0xffffffff);
  (this->super_data_stream).m_attribs = in_CX;
  return (int)CONCAT71((int7)((ulong)pdVar2 >> 8),1);
}

Assistant:

bool open(uint initial_size = 0, const char* pName = "dynamic_stream", uint attribs = cDataStreamSeekable | cDataStreamWritable | cDataStreamReadable) {
    close();

    m_opened = true;
    m_buf.clear();
    m_buf.resize(initial_size);
    m_ofs = 0;
    m_name.set(pName ? pName : "dynamic_stream");
    m_attribs = static_cast<attribs_t>(attribs);
    return true;
  }